

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void remove_show_script_command
               (Am_Object *execute_script_command,Am_Object *cmd_for_menu_bar,Am_Object *undo_db)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  ostream *poVar3;
  Am_Object cmd;
  Am_Value_List bar_list;
  Am_Value_List sub_list;
  Am_Object menu_bar;
  Am_Object AStack_48;
  Am_Value_List local_40;
  Am_Value_List local_30;
  Am_Object local_20;
  
  pAVar2 = Am_Object::Get(undo_db,Am_UNDO_MENU_BAR,0);
  Am_Object::Am_Object(&local_20,pAVar2);
  pAVar2 = Am_Object::Get(&local_20,0xa2,0);
  Am_Value_List::Am_Value_List(&local_40,pAVar2);
  Am_Value_List::Start(&local_40);
  Am_Value_List::Next(&local_40);
  Am_Value_List::Next(&local_40);
  Am_Value_List::Next(&local_40);
  pAVar2 = Am_Value_List::Get(&local_40);
  Am_Object::Am_Object(&AStack_48,pAVar2);
  pAVar2 = Am_Object::Get(&AStack_48,0xa2,0);
  Am_Value_List::Am_Value_List(&local_30,pAVar2);
  Am_Value_List::Start(&local_30);
  value = Am_Object::operator_cast_to_Am_Wrapper_(cmd_for_menu_bar);
  bVar1 = Am_Value_List::Member(&local_30,value);
  if (bVar1) {
    Am_Value_List::Delete(&local_30,false);
    Am_Object::Note_Changed(&AStack_48,0xa2);
    Am_Value_List::~Am_Value_List(&local_30);
    Am_Object::~Am_Object(&AStack_48);
    Am_Value_List::~Am_Value_List(&local_40);
    Am_Object::~Am_Object(&local_20);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Lost cmd_for_menu_bar ",0x16);
  poVar3 = operator<<((ostream *)&std::cerr,cmd_for_menu_bar);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," for execute ",0xd);
  poVar3 = operator<<(poVar3,execute_script_command);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," from list ",0xb);
  poVar3 = operator<<(poVar3,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," on menubar cmd ",0x10);
  poVar3 = operator<<(poVar3,&AStack_48);
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Error();
}

Assistant:

void
remove_show_script_command(Am_Object &execute_script_command,
                           Am_Object &cmd_for_menu_bar, Am_Object &undo_db)
{
  Am_Object menu_bar = undo_db.Get(Am_UNDO_MENU_BAR);
  Am_Value_List bar_list = menu_bar.Get(Am_ITEMS);
  bar_list.Start();                           //at File
  bar_list.Next();                            //at Undo/Redo/Repeat
  bar_list.Next();                            //at Find
  bar_list.Next();                            //at Scripting
  Am_Object cmd = bar_list.Get();             //scripting's command
  Am_Value_List sub_list = cmd.Get(Am_ITEMS); //scripting's sub-menu
  sub_list.Start();
  if (!sub_list.Member(cmd_for_menu_bar))
    Am_ERROR("Lost cmd_for_menu_bar " << cmd_for_menu_bar << " for execute "
                                      << execute_script_command << " from list "
                                      << sub_list << " on menubar cmd " << cmd);
  sub_list.Delete(false);
  cmd.Note_Changed(Am_ITEMS);
}